

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::RangeDynamicLayerParams::Clear(RangeDynamicLayerParams *this)

{
  this->startvalue_ = 0.0;
  this->stepsizevalue_ = 0.0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void RangeDynamicLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.RangeDynamicLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&startvalue_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&stepsizevalue_) -
      reinterpret_cast<char*>(&startvalue_)) + sizeof(stepsizevalue_));
  _internal_metadata_.Clear<std::string>();
}